

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O0

CURLcode curl_mime_data(curl_mimepart *part,char *data,size_t datasize)

{
  char *pcVar1;
  size_t local_28;
  size_t datasize_local;
  char *data_local;
  curl_mimepart *part_local;
  
  if (part == (curl_mimepart *)0x0) {
    part_local._4_4_ = CURLE_BAD_FUNCTION_ARGUMENT;
  }
  else {
    cleanup_part_content(part);
    if (data != (char *)0x0) {
      local_28 = datasize;
      if (datasize == 0xffffffffffffffff) {
        local_28 = strlen(data);
      }
      pcVar1 = (char *)(*Curl_cmalloc)(local_28 + 1);
      part->data = pcVar1;
      if (part->data == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      part->datasize = local_28;
      if (local_28 != 0) {
        memcpy(part->data,data,local_28);
      }
      part->data[local_28] = '\0';
      part->readfunc = mime_mem_read;
      part->seekfunc = mime_mem_seek;
      part->freefunc = mime_mem_free;
      part->flags = part->flags | 4;
      part->kind = MIMEKIND_DATA;
    }
    part_local._4_4_ = CURLE_OK;
  }
  return part_local._4_4_;
}

Assistant:

CURLcode curl_mime_data(curl_mimepart *part,
                        const char *data, size_t datasize)
{
  if(!part)
    return CURLE_BAD_FUNCTION_ARGUMENT;

  cleanup_part_content(part);

  if(data) {
    if(datasize == CURL_ZERO_TERMINATED)
      datasize = strlen(data);

    part->data = malloc(datasize + 1);
    if(!part->data)
      return CURLE_OUT_OF_MEMORY;

    part->datasize = datasize;

    if(datasize)
      memcpy(part->data, data, datasize);
    part->data[datasize] = '\0';    /* Set a null terminator as sentinel. */

    part->readfunc = mime_mem_read;
    part->seekfunc = mime_mem_seek;
    part->freefunc = mime_mem_free;
    part->flags |= MIME_FAST_READ;
    part->kind = MIMEKIND_DATA;
  }

  return CURLE_OK;
}